

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

void CreateSignature(ecs_iter_t *it)

{
  ecs_world_t *world;
  ecs_entity_t *peVar1;
  ecs_entity_t entity;
  uint uVar2;
  undefined8 *puVar3;
  char *name;
  void *pvVar4;
  long lVar5;
  long lVar6;
  EcsSignature sig;
  ecs_sig_t local_48;
  
  world = it->world;
  peVar1 = it->entities;
  puVar3 = (undefined8 *)ecs_column_w_size(it,8,1);
  if (0 < it->count) {
    lVar6 = 0;
    do {
      entity = peVar1[lVar6];
      name = ecs_get_name(world,entity);
      local_48.name = (char *)0x0;
      local_48.expr = (char *)0x0;
      local_48.columns = (ecs_vector_t *)0x0;
      ecs_sig_init(world,name,(char *)*puVar3,&local_48);
      ecs_set_ptr_w_entity(world,entity,9,0x18,&local_48);
      uVar2 = ecs_vector_count(local_48.columns);
      pvVar4 = _ecs_vector_first(local_48.columns,0x28,0x10);
      if (0 < (int)uVar2) {
        lVar5 = 0;
        do {
          if (*(int *)((long)pvVar4 + lVar5) == 4) {
            ecs_add_entity(world,entity,*(ecs_entity_t *)((long)pvVar4 + lVar5 + 0x10));
          }
          lVar5 = lVar5 + 0x28;
        } while ((ulong)uVar2 * 0x28 != lVar5);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < it->count);
  }
  return;
}

Assistant:

static
void CreateSignature(
    ecs_iter_t *it) 
{
    ecs_world_t *world = it->world;
    ecs_entity_t *entities = it->entities;

    EcsSignatureExpr *signature = ecs_column(it, EcsSignatureExpr, 1);
    
    int32_t i;
    for (i = 0; i < it->count; i ++) {
        ecs_entity_t e = entities[i];
        const char *name = ecs_get_name(world, e);

        /* Parse the signature and add the result to the entity */
        EcsSignature sig = {0};
        ecs_sig_init(world, name, signature[0].expr, &sig.signature);
        ecs_set_ptr(world, e, EcsSignature, &sig);

        /* If sig has FromSystem columns, add components to the entity */
        ecs_vector_each(sig.signature.columns, ecs_sig_column_t, column, {
            if (column->from_kind == EcsFromSystem) {
                ecs_add_entity(world, e, column->is.component);
            }
        });    
    }
}